

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Program.cpp
# Opt level: O0

void __thiscall Refal2::CInternalProgramBuilder::check(CInternalProgramBuilder *this)

{
  CErrorsHelper *this_00;
  bool bVar1;
  int iVar2;
  CGlobalFunctionData *this_01;
  ostream *poVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  string local_1c0 [48];
  ostringstream local_190 [8];
  ostringstream stringStream;
  int local_14;
  int globalIndex;
  CInternalProgramBuilder *this_local;
  
  local_14 = 0;
  while( true ) {
    iVar2 = CDictionary<Refal2::CGlobalFunctionData,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::Size(&this->globals);
    if (iVar2 <= local_14) break;
    this_01 = CDictionary<Refal2::CGlobalFunctionData,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::GetData(&this->globals,local_14);
    bVar1 = CGlobalFunctionData::IsDefined(this_01);
    if (!bVar1) {
      std::__cxx11::ostringstream::ostringstream(local_190);
      poVar3 = std::operator<<((ostream *)local_190,"external function `");
      pbVar4 = CDictionary<Refal2::CGlobalFunctionData,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::GetKey(&this->globals,local_14);
      poVar3 = std::operator<<(poVar3,(string *)pbVar4);
      std::operator<<(poVar3,"` was not defined in program");
      this_00 = this->errors;
      std::__cxx11::ostringstream::str();
      CErrorsHelper::RaiseError(this_00,ES_LinkError,local_1c0);
      std::__cxx11::string::~string((string *)local_1c0);
      std::__cxx11::ostringstream::~ostringstream(local_190);
    }
    local_14 = local_14 + 1;
  }
  return;
}

Assistant:

void CInternalProgramBuilder::check()
{
	for( int globalIndex = 0; globalIndex < globals.Size(); globalIndex++ )
	{
		if( !globals.GetData( globalIndex ).IsDefined() ) {
			std::ostringstream stringStream;
			stringStream << "external function `"
				<< globals.GetKey( globalIndex ) <<
				"` was not defined in program";
			errors.RaiseError( ES_LinkError, stringStream.str() );
		}
	}
}